

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O1

laszip_I32 laszip_destroy(laszip_POINTER pointer)

{
  laszip_I32 lVar1;
  
  lVar1 = 1;
  if (pointer != (laszip_POINTER)0x0) {
    lVar1 = laszip_clean(pointer);
    if (*(void **)((long)pointer + 0xaa8) != (void *)0x0) {
      operator_delete(*(void **)((long)pointer + 0xaa8));
    }
    operator_delete(pointer);
  }
  return lVar1;
}

Assistant:

LASZIP_API laszip_I32
laszip_destroy(
    laszip_POINTER                     pointer
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  int err = 0;

  try
  {
    err = laszip_clean(laszip_dll);
    delete laszip_dll;
  }
  catch (...)
  {
    return 1;
  }

  return err;
}